

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage8_avx2(__m256i *x7,__m256i *x8,int32_t *cospi,__m256i *__rounding,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  uint uVar67;
  undefined1 (*in_RCX) [32];
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  char in_R8B;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  __m256i in1_w0_11;
  __m256i in0_w1_11;
  __m256i in1_w1_11;
  __m256i in0_w0_11;
  __m256i in1_w0_10;
  __m256i in0_w1_10;
  __m256i in1_w1_10;
  __m256i in0_w0_10;
  __m256i in1_w0_9;
  __m256i in0_w1_9;
  __m256i in1_w1_9;
  __m256i in0_w0_9;
  __m256i in1_w0_8;
  __m256i in0_w1_8;
  __m256i in1_w1_8;
  __m256i in0_w0_8;
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  __m256i cospi_m12;
  __m256i cospi_m52;
  __m256i cospi_m44;
  __m256i cospi_m20;
  __m256i cospi_m28;
  __m256i cospi_m36;
  __m256i cospi_m60;
  __m256i cospi_m04;
  __m256i cospi_p52;
  __m256i cospi_p12;
  __m256i cospi_p20;
  __m256i cospi_p44;
  __m256i cospi_p36;
  __m256i cospi_p28;
  __m256i cospi_p04;
  __m256i cospi_p60;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar67 = *(uint *)(in_RDX + 0xf0);
  auVar1 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar1 = vpinsrd_avx(auVar1,uVar67,2);
  auVar1 = vpinsrd_avx(auVar1,uVar67,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar2 = vpinsrd_avx(auVar2,uVar67,2);
  auVar2 = vpinsrd_avx(auVar2,uVar67,3);
  uStack_430 = auVar2._0_8_;
  uStack_428 = auVar2._8_8_;
  uVar67 = *(uint *)(in_RDX + 0x10);
  auVar2 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar2 = vpinsrd_avx(auVar2,uVar67,2);
  auVar2 = vpinsrd_avx(auVar2,uVar67,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar3 = vpinsrd_avx(auVar3,uVar67,2);
  auVar3 = vpinsrd_avx(auVar3,uVar67,3);
  uStack_3f0 = auVar3._0_8_;
  uStack_3e8 = auVar3._8_8_;
  uVar67 = *(uint *)(in_RDX + 0x70);
  auVar3 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar3 = vpinsrd_avx(auVar3,uVar67,2);
  auVar3 = vpinsrd_avx(auVar3,uVar67,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar4 = vpinsrd_avx(auVar4,uVar67,2);
  auVar4 = vpinsrd_avx(auVar4,uVar67,3);
  uStack_3b0 = auVar4._0_8_;
  uStack_3a8 = auVar4._8_8_;
  uVar67 = *(uint *)(in_RDX + 0x90);
  auVar4 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar4 = vpinsrd_avx(auVar4,uVar67,2);
  auVar4 = vpinsrd_avx(auVar4,uVar67,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar5 = vpinsrd_avx(auVar5,uVar67,2);
  auVar5 = vpinsrd_avx(auVar5,uVar67,3);
  uStack_370 = auVar5._0_8_;
  uStack_368 = auVar5._8_8_;
  uVar67 = *(uint *)(in_RDX + 0xb0);
  auVar5 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar5 = vpinsrd_avx(auVar5,uVar67,2);
  auVar5 = vpinsrd_avx(auVar5,uVar67,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar6 = vpinsrd_avx(auVar6,uVar67,2);
  auVar6 = vpinsrd_avx(auVar6,uVar67,3);
  uStack_330 = auVar6._0_8_;
  uStack_328 = auVar6._8_8_;
  uVar67 = *(uint *)(in_RDX + 0x50);
  auVar6 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar6 = vpinsrd_avx(auVar6,uVar67,2);
  auVar6 = vpinsrd_avx(auVar6,uVar67,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar7 = vpinsrd_avx(auVar7,uVar67,2);
  auVar7 = vpinsrd_avx(auVar7,uVar67,3);
  uStack_2f0 = auVar7._0_8_;
  uStack_2e8 = auVar7._8_8_;
  uVar67 = *(uint *)(in_RDX + 0x30);
  auVar7 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar7 = vpinsrd_avx(auVar7,uVar67,2);
  auVar7 = vpinsrd_avx(auVar7,uVar67,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar8 = vpinsrd_avx(auVar8,uVar67,2);
  auVar8 = vpinsrd_avx(auVar8,uVar67,3);
  uStack_2b0 = auVar8._0_8_;
  uStack_2a8 = auVar8._8_8_;
  uVar67 = *(uint *)(in_RDX + 0xd0);
  auVar8 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar8 = vpinsrd_avx(auVar8,uVar67,2);
  auVar8 = vpinsrd_avx(auVar8,uVar67,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar9 = vpinsrd_avx(auVar9,uVar67,2);
  auVar9 = vpinsrd_avx(auVar9,uVar67,3);
  uStack_270 = auVar9._0_8_;
  uStack_268 = auVar9._8_8_;
  uVar67 = -*(int *)(in_RDX + 0x10);
  auVar9 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar9 = vpinsrd_avx(auVar9,uVar67,2);
  auVar9 = vpinsrd_avx(auVar9,uVar67,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar10 = vpinsrd_avx(auVar10,uVar67,2);
  auVar10 = vpinsrd_avx(auVar10,uVar67,3);
  uStack_230 = auVar10._0_8_;
  uStack_228 = auVar10._8_8_;
  uVar67 = -*(int *)(in_RDX + 0xf0);
  auVar10 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar10 = vpinsrd_avx(auVar10,uVar67,2);
  auVar10 = vpinsrd_avx(auVar10,uVar67,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar11 = vpinsrd_avx(auVar11,uVar67,2);
  auVar11 = vpinsrd_avx(auVar11,uVar67,3);
  uStack_1f0 = auVar11._0_8_;
  uStack_1e8 = auVar11._8_8_;
  uVar67 = -*(int *)(in_RDX + 0x90);
  auVar11 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar11 = vpinsrd_avx(auVar11,uVar67,2);
  auVar11 = vpinsrd_avx(auVar11,uVar67,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar12 = vpinsrd_avx(auVar12,uVar67,2);
  auVar12 = vpinsrd_avx(auVar12,uVar67,3);
  uStack_1b0 = auVar12._0_8_;
  uStack_1a8 = auVar12._8_8_;
  uVar67 = -*(int *)(in_RDX + 0x70);
  auVar12 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar12 = vpinsrd_avx(auVar12,uVar67,2);
  auVar12 = vpinsrd_avx(auVar12,uVar67,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar13 = vpinsrd_avx(auVar13,uVar67,2);
  auVar13 = vpinsrd_avx(auVar13,uVar67,3);
  uStack_170 = auVar13._0_8_;
  uStack_168 = auVar13._8_8_;
  uVar67 = -*(int *)(in_RDX + 0x50);
  auVar13 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar13 = vpinsrd_avx(auVar13,uVar67,2);
  auVar13 = vpinsrd_avx(auVar13,uVar67,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar14 = vpinsrd_avx(auVar14,uVar67,2);
  auVar14 = vpinsrd_avx(auVar14,uVar67,3);
  uStack_130 = auVar14._0_8_;
  uStack_128 = auVar14._8_8_;
  uVar67 = -*(int *)(in_RDX + 0xb0);
  auVar14 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar14 = vpinsrd_avx(auVar14,uVar67,2);
  auVar14 = vpinsrd_avx(auVar14,uVar67,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar15 = vpinsrd_avx(auVar15,uVar67,2);
  auVar15 = vpinsrd_avx(auVar15,uVar67,3);
  uStack_f0 = auVar15._0_8_;
  uStack_e8 = auVar15._8_8_;
  uVar67 = -*(int *)(in_RDX + 0xd0);
  auVar15 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar15 = vpinsrd_avx(auVar15,uVar67,2);
  auVar15 = vpinsrd_avx(auVar15,uVar67,3);
  auVar69 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar69 = vpinsrd_avx(auVar69,uVar67,2);
  auVar69 = vpinsrd_avx(auVar69,uVar67,3);
  uStack_b0 = auVar69._0_8_;
  uStack_a8 = auVar69._8_8_;
  uVar67 = -*(int *)(in_RDX + 0x30);
  auVar69 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar69 = vpinsrd_avx(auVar69,uVar67,2);
  auVar69 = vpinsrd_avx(auVar69,uVar67,3);
  auVar68 = vpinsrd_avx(ZEXT416(uVar67),uVar67,1);
  auVar68 = vpinsrd_avx(auVar68,uVar67,2);
  auVar68 = vpinsrd_avx(auVar68,uVar67,3);
  auVar68 = ZEXT116(0) * auVar69 + ZEXT116(1) * auVar68;
  auVar69 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69;
  uStack_70 = auVar69._0_8_;
  uStack_68 = auVar69._8_8_;
  uVar18 = in_RDI[1];
  uVar19 = in_RDI[2];
  uVar20 = in_RDI[3];
  *in_RSI = *in_RDI;
  in_RSI[1] = uVar18;
  in_RSI[2] = uVar19;
  in_RSI[3] = uVar20;
  uVar18 = in_RDI[5];
  uVar19 = in_RDI[6];
  uVar20 = in_RDI[7];
  in_RSI[4] = in_RDI[4];
  in_RSI[5] = uVar18;
  in_RSI[6] = uVar19;
  in_RSI[7] = uVar20;
  uVar18 = in_RDI[9];
  uVar19 = in_RDI[10];
  uVar20 = in_RDI[0xb];
  in_RSI[8] = in_RDI[8];
  in_RSI[9] = uVar18;
  in_RSI[10] = uVar19;
  in_RSI[0xb] = uVar20;
  uVar18 = in_RDI[0xd];
  uVar19 = in_RDI[0xe];
  uVar20 = in_RDI[0xf];
  in_RSI[0xc] = in_RDI[0xc];
  in_RSI[0xd] = uVar18;
  in_RSI[0xe] = uVar19;
  in_RSI[0xf] = uVar20;
  uVar18 = in_RDI[0x11];
  uVar19 = in_RDI[0x12];
  uVar20 = in_RDI[0x13];
  in_RSI[0x10] = in_RDI[0x10];
  in_RSI[0x11] = uVar18;
  in_RSI[0x12] = uVar19;
  in_RSI[0x13] = uVar20;
  uVar18 = in_RDI[0x15];
  uVar19 = in_RDI[0x16];
  uVar20 = in_RDI[0x17];
  in_RSI[0x14] = in_RDI[0x14];
  in_RSI[0x15] = uVar18;
  in_RSI[0x16] = uVar19;
  in_RSI[0x17] = uVar20;
  uVar18 = in_RDI[0x19];
  uVar19 = in_RDI[0x1a];
  uVar20 = in_RDI[0x1b];
  in_RSI[0x18] = in_RDI[0x18];
  in_RSI[0x19] = uVar18;
  in_RSI[0x1a] = uVar19;
  in_RSI[0x1b] = uVar20;
  uVar18 = in_RDI[0x1d];
  uVar19 = in_RDI[0x1e];
  uVar20 = in_RDI[0x1f];
  in_RSI[0x1c] = in_RDI[0x1c];
  in_RSI[0x1d] = uVar18;
  in_RSI[0x1e] = uVar19;
  in_RSI[0x1f] = uVar20;
  auVar66._16_8_ = uStack_3f0;
  auVar66._0_16_ = auVar2;
  auVar66._24_8_ = uStack_3e8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x3c),auVar66);
  auVar65._16_8_ = uStack_430;
  auVar65._0_16_ = auVar1;
  auVar65._24_8_ = uStack_428;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x20),auVar65);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x20) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x20),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x20) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x20),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x20) = auVar16;
  auVar64._16_8_ = uStack_430;
  auVar64._0_16_ = auVar1;
  auVar64._24_8_ = uStack_428;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x3c),auVar64);
  auVar63._16_8_ = uStack_3f0;
  auVar63._0_16_ = auVar2;
  auVar63._24_8_ = uStack_3e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x20),auVar63);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x3c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x3c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar16;
  auVar62._16_8_ = uStack_370;
  auVar62._0_16_ = auVar4;
  auVar62._24_8_ = uStack_368;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x38),auVar62);
  auVar61._16_8_ = uStack_3b0;
  auVar61._0_16_ = auVar3;
  auVar61._24_8_ = uStack_3a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x24),auVar61);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x24) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x24),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x24) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x24),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x24) = auVar16;
  auVar60._16_8_ = uStack_3b0;
  auVar60._0_16_ = auVar3;
  auVar60._24_8_ = uStack_3a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x38),auVar60);
  auVar59._16_8_ = uStack_370;
  auVar59._0_16_ = auVar4;
  auVar59._24_8_ = uStack_368;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x24),auVar59);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x38) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x38),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x38) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x38),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x38) = auVar16;
  auVar58._16_8_ = uStack_2f0;
  auVar58._0_16_ = auVar6;
  auVar58._24_8_ = uStack_2e8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x34),auVar58);
  auVar57._16_8_ = uStack_330;
  auVar57._0_16_ = auVar5;
  auVar57._24_8_ = uStack_328;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x28),auVar57);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x28) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x28),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x28) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x28),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x28) = auVar16;
  auVar56._16_8_ = uStack_330;
  auVar56._0_16_ = auVar5;
  auVar56._24_8_ = uStack_328;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x34),auVar56);
  auVar55._16_8_ = uStack_2f0;
  auVar55._0_16_ = auVar6;
  auVar55._24_8_ = uStack_2e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x28),auVar55);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x34) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x34),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x34) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x34),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x34) = auVar16;
  auVar54._16_8_ = uStack_270;
  auVar54._0_16_ = auVar8;
  auVar54._24_8_ = uStack_268;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x30),auVar54);
  auVar53._16_8_ = uStack_2b0;
  auVar53._0_16_ = auVar7;
  auVar53._24_8_ = uStack_2a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x2c),auVar53);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x2c),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x2c),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar16;
  auVar52._16_8_ = uStack_2b0;
  auVar52._0_16_ = auVar7;
  auVar52._24_8_ = uStack_2a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x30),auVar52);
  auVar51._16_8_ = uStack_270;
  auVar51._0_16_ = auVar8;
  auVar51._24_8_ = uStack_268;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x2c),auVar51);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x30) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x30),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x30) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x30),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x30) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x40),*(undefined1 (*) [32])(in_RDI + 0x44))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x40) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x40),*(undefined1 (*) [32])(in_RDI + 0x44))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x4c),*(undefined1 (*) [32])(in_RDI + 0x48))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x4c),*(undefined1 (*) [32])(in_RDI + 0x48))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x4c) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x50),*(undefined1 (*) [32])(in_RDI + 0x54))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x50) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x50),*(undefined1 (*) [32])(in_RDI + 0x54))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x5c),*(undefined1 (*) [32])(in_RDI + 0x58))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x5c),*(undefined1 (*) [32])(in_RDI + 0x58))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x5c) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x60),*(undefined1 (*) [32])(in_RDI + 100));
  *(undefined1 (*) [32])(in_RSI + 0x60) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x60),*(undefined1 (*) [32])(in_RDI + 100));
  *(undefined1 (*) [32])(in_RSI + 100) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x6c),*(undefined1 (*) [32])(in_RDI + 0x68))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x6c),*(undefined1 (*) [32])(in_RDI + 0x68))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x6c) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x70),*(undefined1 (*) [32])(in_RDI + 0x74))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x70) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x70),*(undefined1 (*) [32])(in_RDI + 0x74))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar16;
  auVar16 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x7c),*(undefined1 (*) [32])(in_RDI + 0x78))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x7c),*(undefined1 (*) [32])(in_RDI + 0x78))
  ;
  *(undefined1 (*) [32])(in_RSI + 0x7c) = auVar16;
  uVar18 = in_RDI[0x81];
  uVar19 = in_RDI[0x82];
  uVar20 = in_RDI[0x83];
  in_RSI[0x80] = in_RDI[0x80];
  in_RSI[0x81] = uVar18;
  in_RSI[0x82] = uVar19;
  in_RSI[0x83] = uVar20;
  auVar50._16_8_ = uStack_230;
  auVar50._0_16_ = auVar9;
  auVar50._24_8_ = uStack_228;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x84),auVar50);
  auVar49._16_8_ = uStack_430;
  auVar49._0_16_ = auVar1;
  auVar49._24_8_ = uStack_428;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf8),auVar49);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x84),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x84),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar16;
  auVar48._16_8_ = uStack_430;
  auVar48._0_16_ = auVar1;
  auVar48._24_8_ = uStack_428;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x84),auVar48);
  auVar47._16_8_ = uStack_230;
  auVar47._0_16_ = auVar9;
  auVar47._24_8_ = uStack_228;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf8),auVar47);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xf8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xf8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar16;
  auVar46._16_8_ = uStack_1f0;
  auVar46._0_16_ = auVar10;
  auVar46._24_8_ = uStack_1e8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x88),auVar46);
  auVar45._16_8_ = uStack_230;
  auVar45._0_16_ = auVar9;
  auVar45._24_8_ = uStack_228;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf4),auVar45);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x88),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x88),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar16;
  auVar44._16_8_ = uStack_230;
  auVar44._0_16_ = auVar9;
  auVar44._24_8_ = uStack_228;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x88),auVar44);
  auVar43._16_8_ = uStack_1f0;
  auVar43._0_16_ = auVar10;
  auVar43._24_8_ = uStack_1e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xf4),auVar43);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xf4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xf4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar16;
  uVar18 = in_RDI[0x8d];
  uVar19 = in_RDI[0x8e];
  uVar20 = in_RDI[0x8f];
  in_RSI[0x8c] = in_RDI[0x8c];
  in_RSI[0x8d] = uVar18;
  in_RSI[0x8e] = uVar19;
  in_RSI[0x8f] = uVar20;
  uVar18 = in_RDI[0x91];
  uVar19 = in_RDI[0x92];
  uVar20 = in_RDI[0x93];
  in_RSI[0x90] = in_RDI[0x90];
  in_RSI[0x91] = uVar18;
  in_RSI[0x92] = uVar19;
  in_RSI[0x93] = uVar20;
  auVar42._16_8_ = uStack_1b0;
  auVar42._0_16_ = auVar11;
  auVar42._24_8_ = uStack_1a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x94),auVar42);
  auVar41._16_8_ = uStack_3b0;
  auVar41._0_16_ = auVar3;
  auVar41._24_8_ = uStack_3a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe8),auVar41);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x94),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x94),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar16;
  auVar40._16_8_ = uStack_3b0;
  auVar40._0_16_ = auVar3;
  auVar40._24_8_ = uStack_3a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x94),auVar40);
  auVar39._16_8_ = uStack_1b0;
  auVar39._0_16_ = auVar11;
  auVar39._24_8_ = uStack_1a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe8),auVar39);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xe8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xe8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar16;
  auVar38._16_8_ = uStack_170;
  auVar38._0_16_ = auVar12;
  auVar38._24_8_ = uStack_168;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x98),auVar38);
  auVar37._16_8_ = uStack_1b0;
  auVar37._0_16_ = auVar11;
  auVar37._24_8_ = uStack_1a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe4),auVar37);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x98),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x98),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar16;
  auVar36._16_8_ = uStack_1b0;
  auVar36._0_16_ = auVar11;
  auVar36._24_8_ = uStack_1a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x98),auVar36);
  auVar35._16_8_ = uStack_170;
  auVar35._0_16_ = auVar12;
  auVar35._24_8_ = uStack_168;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xe4),auVar35);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xe4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xe4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar16;
  uVar18 = in_RDI[0x9d];
  uVar19 = in_RDI[0x9e];
  uVar20 = in_RDI[0x9f];
  in_RSI[0x9c] = in_RDI[0x9c];
  in_RSI[0x9d] = uVar18;
  in_RSI[0x9e] = uVar19;
  in_RSI[0x9f] = uVar20;
  uVar18 = in_RDI[0xa1];
  uVar19 = in_RDI[0xa2];
  uVar20 = in_RDI[0xa3];
  in_RSI[0xa0] = in_RDI[0xa0];
  in_RSI[0xa1] = uVar18;
  in_RSI[0xa2] = uVar19;
  in_RSI[0xa3] = uVar20;
  auVar34._16_8_ = uStack_130;
  auVar34._0_16_ = auVar13;
  auVar34._24_8_ = uStack_128;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa4),auVar34);
  auVar33._16_8_ = uStack_330;
  auVar33._0_16_ = auVar5;
  auVar33._24_8_ = uStack_328;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd8),auVar33);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xa4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xa4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar16;
  auVar32._16_8_ = uStack_330;
  auVar32._0_16_ = auVar5;
  auVar32._24_8_ = uStack_328;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa4),auVar32);
  auVar31._16_8_ = uStack_130;
  auVar31._0_16_ = auVar13;
  auVar31._24_8_ = uStack_128;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd8),auVar31);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xd8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xd8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar16;
  auVar30._16_8_ = uStack_f0;
  auVar30._0_16_ = auVar14;
  auVar30._24_8_ = uStack_e8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa8),auVar30);
  auVar29._16_8_ = uStack_130;
  auVar29._0_16_ = auVar13;
  auVar29._24_8_ = uStack_128;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd4),auVar29);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xa8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xa8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar16;
  auVar28._16_8_ = uStack_130;
  auVar28._0_16_ = auVar13;
  auVar28._24_8_ = uStack_128;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xa8),auVar28);
  auVar27._16_8_ = uStack_f0;
  auVar27._0_16_ = auVar14;
  auVar27._24_8_ = uStack_e8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xd4),auVar27);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xd4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xd4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar16;
  uVar18 = in_RDI[0xad];
  uVar19 = in_RDI[0xae];
  uVar20 = in_RDI[0xaf];
  in_RSI[0xac] = in_RDI[0xac];
  in_RSI[0xad] = uVar18;
  in_RSI[0xae] = uVar19;
  in_RSI[0xaf] = uVar20;
  uVar18 = in_RDI[0xb1];
  uVar19 = in_RDI[0xb2];
  uVar20 = in_RDI[0xb3];
  in_RSI[0xb0] = in_RDI[0xb0];
  in_RSI[0xb1] = uVar18;
  in_RSI[0xb2] = uVar19;
  in_RSI[0xb3] = uVar20;
  auVar26._16_8_ = uStack_b0;
  auVar26._0_16_ = auVar15;
  auVar26._24_8_ = uStack_a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb4),auVar26);
  auVar25._16_8_ = uStack_2b0;
  auVar25._0_16_ = auVar7;
  auVar25._24_8_ = uStack_2a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 200),auVar25);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xb4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xb4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar16;
  auVar24._16_8_ = uStack_2b0;
  auVar24._0_16_ = auVar7;
  auVar24._24_8_ = uStack_2a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb4),auVar24);
  auVar23._16_8_ = uStack_b0;
  auVar23._0_16_ = auVar15;
  auVar23._24_8_ = uStack_a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 200),auVar23);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 200) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 200),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 200) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 200),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 200) = auVar16;
  auVar22._16_8_ = uStack_70;
  auVar22._0_16_ = auVar68;
  auVar22._24_8_ = uStack_68;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb8),auVar22);
  auVar21._16_8_ = uStack_b0;
  auVar21._0_16_ = auVar15;
  auVar21._24_8_ = uStack_a8;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xc4),auVar21);
  auVar16 = vpaddd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xb8),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xb8),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar16;
  auVar16._16_8_ = uStack_b0;
  auVar16._0_16_ = auVar15;
  auVar16._24_8_ = uStack_a8;
  auVar16 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xb8),auVar16);
  auVar17._16_8_ = uStack_70;
  auVar17._0_16_ = auVar68;
  auVar17._24_8_ = uStack_68;
  auVar17 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0xc4),auVar17);
  auVar16 = vpsubd_avx2(auVar16,auVar17);
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar16;
  auVar16 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0xc4),*in_RCX);
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar16;
  auVar16 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0xc4),ZEXT416((uint)(int)in_R8B));
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar16;
  uVar18 = in_RDI[0xbd];
  uVar19 = in_RDI[0xbe];
  uVar20 = in_RDI[0xbf];
  in_RSI[0xbc] = in_RDI[0xbc];
  in_RSI[0xbd] = uVar18;
  in_RSI[0xbe] = uVar19;
  in_RSI[0xbf] = uVar20;
  uVar18 = in_RDI[0xc1];
  uVar19 = in_RDI[0xc2];
  uVar20 = in_RDI[0xc3];
  in_RSI[0xc0] = in_RDI[0xc0];
  in_RSI[0xc1] = uVar18;
  in_RSI[0xc2] = uVar19;
  in_RSI[0xc3] = uVar20;
  uVar18 = in_RDI[0xcd];
  uVar19 = in_RDI[0xce];
  uVar20 = in_RDI[0xcf];
  in_RSI[0xcc] = in_RDI[0xcc];
  in_RSI[0xcd] = uVar18;
  in_RSI[0xce] = uVar19;
  in_RSI[0xcf] = uVar20;
  uVar18 = in_RDI[0xd1];
  uVar19 = in_RDI[0xd2];
  uVar20 = in_RDI[0xd3];
  in_RSI[0xd0] = in_RDI[0xd0];
  in_RSI[0xd1] = uVar18;
  in_RSI[0xd2] = uVar19;
  in_RSI[0xd3] = uVar20;
  uVar18 = in_RDI[0xdd];
  uVar19 = in_RDI[0xde];
  uVar20 = in_RDI[0xdf];
  in_RSI[0xdc] = in_RDI[0xdc];
  in_RSI[0xdd] = uVar18;
  in_RSI[0xde] = uVar19;
  in_RSI[0xdf] = uVar20;
  uVar18 = in_RDI[0xe1];
  uVar19 = in_RDI[0xe2];
  uVar20 = in_RDI[0xe3];
  in_RSI[0xe0] = in_RDI[0xe0];
  in_RSI[0xe1] = uVar18;
  in_RSI[0xe2] = uVar19;
  in_RSI[0xe3] = uVar20;
  uVar18 = in_RDI[0xed];
  uVar19 = in_RDI[0xee];
  uVar20 = in_RDI[0xef];
  in_RSI[0xec] = in_RDI[0xec];
  in_RSI[0xed] = uVar18;
  in_RSI[0xee] = uVar19;
  in_RSI[0xef] = uVar20;
  uVar18 = in_RDI[0xf1];
  uVar19 = in_RDI[0xf2];
  uVar20 = in_RDI[0xf3];
  in_RSI[0xf0] = in_RDI[0xf0];
  in_RSI[0xf1] = uVar18;
  in_RSI[0xf2] = uVar19;
  in_RSI[0xf3] = uVar20;
  uVar18 = in_RDI[0xfd];
  uVar19 = in_RDI[0xfe];
  uVar20 = in_RDI[0xff];
  in_RSI[0xfc] = in_RDI[0xfc];
  in_RSI[0xfd] = uVar18;
  in_RSI[0xfe] = uVar19;
  in_RSI[0xff] = uVar20;
  return;
}

Assistant:

static inline void fdct64_stage8_avx2(__m256i *x7, __m256i *x8,
                                      const int32_t *cospi,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  __m256i cospi_p60 = _mm256_set1_epi32(cospi[60]);
  __m256i cospi_p04 = _mm256_set1_epi32(cospi[4]);
  __m256i cospi_p28 = _mm256_set1_epi32(cospi[28]);
  __m256i cospi_p36 = _mm256_set1_epi32(cospi[36]);
  __m256i cospi_p44 = _mm256_set1_epi32(cospi[44]);
  __m256i cospi_p20 = _mm256_set1_epi32(cospi[20]);
  __m256i cospi_p12 = _mm256_set1_epi32(cospi[12]);
  __m256i cospi_p52 = _mm256_set1_epi32(cospi[52]);
  __m256i cospi_m04 = _mm256_set1_epi32(-cospi[4]);
  __m256i cospi_m60 = _mm256_set1_epi32(-cospi[60]);
  __m256i cospi_m36 = _mm256_set1_epi32(-cospi[36]);
  __m256i cospi_m28 = _mm256_set1_epi32(-cospi[28]);
  __m256i cospi_m20 = _mm256_set1_epi32(-cospi[20]);
  __m256i cospi_m44 = _mm256_set1_epi32(-cospi[44]);
  __m256i cospi_m52 = _mm256_set1_epi32(-cospi[52]);
  __m256i cospi_m12 = _mm256_set1_epi32(-cospi[12]);

  x8[0] = x7[0];
  x8[1] = x7[1];
  x8[2] = x7[2];
  x8[3] = x7[3];
  x8[4] = x7[4];
  x8[5] = x7[5];
  x8[6] = x7[6];
  x8[7] = x7[7];

  btf_32_type0_avx2_new(cospi_p04, cospi_p60, x7[15], x7[8], x8[8], x8[15],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p36, cospi_p28, x7[14], x7[9], x8[9], x8[14],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p20, cospi_p44, x7[13], x7[10], x8[10], x8[13],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_p52, cospi_p12, x7[12], x7[11], x8[11], x8[12],
                        *__rounding, cos_bit);
  x8[16] = _mm256_add_epi32(x7[16], x7[17]);
  x8[17] = _mm256_sub_epi32(x7[16], x7[17]);
  x8[18] = _mm256_sub_epi32(x7[19], x7[18]);
  x8[19] = _mm256_add_epi32(x7[19], x7[18]);
  x8[20] = _mm256_add_epi32(x7[20], x7[21]);
  x8[21] = _mm256_sub_epi32(x7[20], x7[21]);
  x8[22] = _mm256_sub_epi32(x7[23], x7[22]);
  x8[23] = _mm256_add_epi32(x7[23], x7[22]);
  x8[24] = _mm256_add_epi32(x7[24], x7[25]);
  x8[25] = _mm256_sub_epi32(x7[24], x7[25]);
  x8[26] = _mm256_sub_epi32(x7[27], x7[26]);
  x8[27] = _mm256_add_epi32(x7[27], x7[26]);
  x8[28] = _mm256_add_epi32(x7[28], x7[29]);
  x8[29] = _mm256_sub_epi32(x7[28], x7[29]);
  x8[30] = _mm256_sub_epi32(x7[31], x7[30]);
  x8[31] = _mm256_add_epi32(x7[31], x7[30]);
  x8[32] = x7[32];
  btf_32_type0_avx2_new(cospi_m04, cospi_p60, x7[33], x7[62], x8[33], x8[62],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_m60, cospi_m04, x7[34], x7[61], x8[34], x8[61],
                        *__rounding, cos_bit);
  x8[35] = x7[35];
  x8[36] = x7[36];
  btf_32_type0_avx2_new(cospi_m36, cospi_p28, x7[37], x7[58], x8[37], x8[58],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_m28, cospi_m36, x7[38], x7[57], x8[38], x8[57],
                        *__rounding, cos_bit);
  x8[39] = x7[39];
  x8[40] = x7[40];
  btf_32_type0_avx2_new(cospi_m20, cospi_p44, x7[41], x7[54], x8[41], x8[54],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_m44, cospi_m20, x7[42], x7[53], x8[42], x8[53],
                        *__rounding, cos_bit);
  x8[43] = x7[43];
  x8[44] = x7[44];
  btf_32_type0_avx2_new(cospi_m52, cospi_p12, x7[45], x7[50], x8[45], x8[50],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(cospi_m12, cospi_m52, x7[46], x7[49], x8[46], x8[49],
                        *__rounding, cos_bit);
  x8[47] = x7[47];
  x8[48] = x7[48];
  x8[51] = x7[51];
  x8[52] = x7[52];
  x8[55] = x7[55];
  x8[56] = x7[56];
  x8[59] = x7[59];
  x8[60] = x7[60];
  x8[63] = x7[63];
}